

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O1

void __thiscall QDirListingPrivate::advance(QDirListingPrivate *this)

{
  pointer puVar1;
  QAbstractFileEngineIterator *pQVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  pointer puVar5;
  _Storage<QFileInfo,_false> _Var6;
  char16_t *pcVar7;
  QArrayData *pQVar8;
  char *pcVar9;
  undefined1 *puVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  undefined8 extraout_RAX;
  long in_FS_OFFSET;
  _Storage<QFileInfo,_false> local_138;
  char16_t *pcStack_130;
  undefined1 *local_128;
  QArrayData *pQStack_120;
  char *local_118;
  undefined1 *puStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  _Storage<QFileInfo,_false> local_c8;
  ulong uStack_c0;
  _Storage<QFileInfo,_false> local_b8;
  char16_t *pcStack_b0;
  undefined1 *local_a8;
  QArrayData *pQStack_a0;
  char *local_98;
  undefined1 *puStack_90;
  undefined8 local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  _Storage<QFileInfo,_false> local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->engine)._M_t.
      super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
      super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
      super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl == (QAbstractFileEngine *)0x0
     ) {
    local_48 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_a0 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)&local_b8._M_value);
    puStack_80 = (undefined1 *)0x0;
    local_78 = (undefined1 *)0xffffffffffffffff;
    puStack_70 = (undefined1 *)0x0;
    local_68 = (undefined1 *)0x0;
    puStack_60 = (undefined1 *)0x0;
    local_58 = (undefined1 *)0x0;
    puStack_50 = (undefined1 *)0xfffffffefffffffe;
    puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
    do {
      if ((this->nativeIterators).
          super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->nativeIterators).
          super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      while( true ) {
        puVar5 = (this->nativeIterators).
                 super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->nativeIterators).
            super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == puVar5) goto LAB_00231a1c;
        bVar11 = QFileSystemIterator::advance
                           (puVar5[-1]._M_t.
                            super___uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QFileSystemIterator_*,_std::default_delete<QFileSystemIterator>_>
                            .super__Head_base<0UL,_QFileSystemIterator_*,_false>._M_head_impl,
                            (QFileSystemEntry *)&local_b8._M_value,
                            (QFileSystemMetaData *)&puStack_80);
        if (!bVar11) {
          std::
          vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
          ::pop_back(&this->nativeIterators);
          goto LAB_00231961;
        }
        bVar12 = entryMatches(this,(QDirEntryInfo *)&local_b8._M_value);
        puVar10 = local_88;
        if (bVar12) break;
        local_c8 = (_Storage<QFileInfo,_false>)0x0;
        uStack_c0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        local_108 = 0;
        uStack_100 = 0;
        local_118 = (char *)0x0;
        puStack_110 = (undefined1 *)0x0;
        local_128 = (undefined1 *)0x0;
        pQStack_120 = (QArrayData *)0x0;
        local_138 = (_Storage<QFileInfo,_false>)0x0;
        pcStack_130 = (char16_t *)0x0;
        QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)&local_138._M_value);
        puVar3 = puStack_90;
        pcVar9 = local_98;
        pQVar8 = pQStack_a0;
        puVar10 = local_a8;
        pcVar7 = pcStack_b0;
        _Var6 = local_b8;
        uStack_100 = 0;
        local_f8 = 0xffffffffffffffff;
        uStack_e0 = 0;
        local_d8 = 0;
        uStack_f0 = 0;
        local_e8 = 0;
        uStack_d0 = 0xfffffffefffffffe;
        uStack_c0 = uStack_c0 & 0xffffffffffffff00;
        local_b8 = local_138;
        pcStack_b0 = pcStack_130;
        local_138 = _Var6;
        pcStack_130 = pcVar7;
        local_a8 = local_128;
        local_128 = puVar10;
        pQStack_a0 = pQStack_120;
        local_98 = local_118;
        pQStack_120 = pQVar8;
        local_118 = pcVar9;
        puStack_90 = puStack_110;
        puStack_110 = puVar3;
        local_88 = (undefined1 *)
                   CONCAT44(CONCAT22(local_88._6_2_,local_108._4_2_),(undefined4)local_108);
        puStack_50 = (undefined1 *)0xfffffffefffffffe;
        puStack_60 = (undefined1 *)0x0;
        local_58 = (undefined1 *)0x0;
        puStack_70 = (undefined1 *)0x0;
        local_68 = (undefined1 *)0x0;
        puStack_80 = (undefined1 *)0x0;
        local_78 = (undefined1 *)0xffffffffffffffff;
        std::_Optional_payload_base<QFileInfo>::_M_move_assign
                  ((_Optional_payload_base<QFileInfo> *)&local_48._M_value,
                   (_Optional_payload_base<QFileInfo> *)&local_c8._M_value);
        if ((char)uStack_c0 == '\x01') {
          uStack_c0 = uStack_c0 & 0xffffffffffffff00;
          QFileInfo::~QFileInfo(&local_c8._M_value);
        }
        if (pQStack_120 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_120->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQStack_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQStack_120,1,0x10);
          }
        }
        if ((QArrayData *)local_138.field2 != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_138 = *(int *)local_138 + -1;
          UNLOCK();
          if (*(int *)local_138 == 0) {
            QArrayData::deallocate((QArrayData *)local_138,2,0x10);
          }
        }
      }
      _Var6 = (_Storage<QFileInfo,_false>)(this->currentEntryInfo).entry.m_filePath.d.d;
      pcVar7 = (this->currentEntryInfo).entry.m_filePath.d.ptr;
      (this->currentEntryInfo).entry.m_filePath.d.d = (Data *)local_b8;
      (this->currentEntryInfo).entry.m_filePath.d.ptr = pcStack_b0;
      puVar3 = (undefined1 *)(this->currentEntryInfo).entry.m_filePath.d.size;
      (this->currentEntryInfo).entry.m_filePath.d.size = (qsizetype)local_a8;
      pQVar8 = &((this->currentEntryInfo).entry.m_nativeFilePath.d.d)->super_QArrayData;
      pcVar9 = (this->currentEntryInfo).entry.m_nativeFilePath.d.ptr;
      (this->currentEntryInfo).entry.m_nativeFilePath.d.d = (Data *)pQStack_a0;
      (this->currentEntryInfo).entry.m_nativeFilePath.d.ptr = local_98;
      puVar4 = (undefined1 *)(this->currentEntryInfo).entry.m_nativeFilePath.d.size;
      (this->currentEntryInfo).entry.m_nativeFilePath.d.size = (qsizetype)puStack_90;
      (this->currentEntryInfo).entry.m_lastDotInFileName = local_88._4_2_;
      (this->currentEntryInfo).entry.m_lastSeparator = (undefined2)local_88;
      (this->currentEntryInfo).entry.m_firstDotInFileName = local_88._2_2_;
      *(undefined1 **)&(this->currentEntryInfo).metaData.userId_ = puStack_50;
      (this->currentEntryInfo).metaData.metadataChangeTime_ = (qint64)puStack_60;
      (this->currentEntryInfo).metaData.modificationTime_ = (qint64)local_58;
      (this->currentEntryInfo).metaData.accessTime_ = (qint64)puStack_70;
      (this->currentEntryInfo).metaData.birthTime_ = (qint64)local_68;
      *(undefined1 **)&(this->currentEntryInfo).metaData = puStack_80;
      (this->currentEntryInfo).metaData.size_ = (qint64)local_78;
      local_b8 = _Var6;
      pcStack_b0 = pcVar7;
      local_a8 = puVar3;
      pQStack_a0 = pQVar8;
      local_98 = pcVar9;
      puStack_90 = puVar4;
      local_88 = puVar10;
      std::_Optional_payload_base<QFileInfo>::_M_move_assign
                ((_Optional_payload_base<QFileInfo> *)&(this->currentEntryInfo).fileInfoOpt,
                 (_Optional_payload_base<QFileInfo> *)&local_48._M_value);
LAB_00231961:
    } while (!bVar11);
    if ((char)puStack_40 == '\x01') {
      puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
      QFileInfo::~QFileInfo(&local_48._M_value);
    }
    if (pQStack_a0 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_a0,1,0x10);
      }
    }
    if ((QArrayData *)local_b8.field2 != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_b8 = *(int *)local_b8 + -1;
      UNLOCK();
      if (*(int *)local_b8 == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
  }
  else {
    while ((this->fileEngineIterators).
           super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->fileEngineIterators).
           super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002312ec:
      do {
        puVar1 = (this->fileEngineIterators).
                 super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->fileEngineIterators).
            super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == puVar1) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            advance();
LAB_00231a1c:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              advance();
              QDirEntryInfo::~QDirEntryInfo((QDirEntryInfo *)&local_b8._M_value);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(extraout_RAX);
              }
            }
          }
          goto LAB_00231aa1;
        }
        pQVar2 = puVar1[-1]._M_t.
                 super___uniq_ptr_impl<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngineIterator_*,_std::default_delete<QAbstractFileEngineIterator>_>
                 .super__Head_base<0UL,_QAbstractFileEngineIterator_*,_false>._M_head_impl;
        iVar13 = (*pQVar2->_vptr_QAbstractFileEngineIterator[2])(pQVar2);
        if ((char)iVar13 == '\0') {
          std::
          vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
          ::pop_back(&this->fileEngineIterators);
          break;
        }
        local_48 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_a0 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)&local_b8._M_value);
        puStack_80 = (undefined1 *)0x0;
        local_78 = (undefined1 *)0xffffffffffffffff;
        puStack_60 = (undefined1 *)0x0;
        local_58 = (undefined1 *)0x0;
        puStack_70 = (undefined1 *)0x0;
        local_68 = (undefined1 *)0x0;
        puStack_50 = (undefined1 *)0xfffffffefffffffe;
        puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
        (*pQVar2->_vptr_QAbstractFileEngineIterator[4])(&local_138,pQVar2);
        _Var6 = local_48;
        if ((char)puStack_40 == '\x01') {
          local_48 = local_138;
          local_138 = _Var6;
        }
        else {
          QFileInfo::QFileInfo(&local_48._M_value,&local_138._M_value);
          puStack_40 = (undefined1 *)CONCAT71(puStack_40._1_7_,1);
        }
        QFileInfo::~QFileInfo(&local_138._M_value);
        bVar11 = entryMatches(this,(QDirEntryInfo *)&local_b8._M_value);
        puVar10 = local_88;
        if (!bVar11) {
          if ((char)puStack_40 == '\x01') {
            puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
            QFileInfo::~QFileInfo(&local_48._M_value);
          }
          if (pQStack_a0 != (QArrayData *)0x0) {
            LOCK();
            (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQStack_a0,1,0x10);
            }
          }
          if ((QArrayData *)local_b8.field2 != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_b8 = *(int *)local_b8 + -1;
            UNLOCK();
            if (*(int *)local_b8 == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          goto LAB_002312ec;
        }
        _Var6 = (_Storage<QFileInfo,_false>)(this->currentEntryInfo).entry.m_filePath.d.d;
        pcVar7 = (this->currentEntryInfo).entry.m_filePath.d.ptr;
        (this->currentEntryInfo).entry.m_filePath.d.d = (Data *)local_b8;
        (this->currentEntryInfo).entry.m_filePath.d.ptr = pcStack_b0;
        puVar3 = (undefined1 *)(this->currentEntryInfo).entry.m_filePath.d.size;
        (this->currentEntryInfo).entry.m_filePath.d.size = (qsizetype)local_a8;
        pQVar8 = &((this->currentEntryInfo).entry.m_nativeFilePath.d.d)->super_QArrayData;
        pcVar9 = (this->currentEntryInfo).entry.m_nativeFilePath.d.ptr;
        (this->currentEntryInfo).entry.m_nativeFilePath.d.d = (Data *)pQStack_a0;
        (this->currentEntryInfo).entry.m_nativeFilePath.d.ptr = local_98;
        puVar4 = (undefined1 *)(this->currentEntryInfo).entry.m_nativeFilePath.d.size;
        (this->currentEntryInfo).entry.m_nativeFilePath.d.size = (qsizetype)puStack_90;
        (this->currentEntryInfo).entry.m_lastDotInFileName = local_88._4_2_;
        (this->currentEntryInfo).entry.m_lastSeparator = (undefined2)local_88;
        (this->currentEntryInfo).entry.m_firstDotInFileName = local_88._2_2_;
        *(undefined1 **)&(this->currentEntryInfo).metaData.userId_ = puStack_50;
        (this->currentEntryInfo).metaData.metadataChangeTime_ = (qint64)puStack_60;
        (this->currentEntryInfo).metaData.modificationTime_ = (qint64)local_58;
        (this->currentEntryInfo).metaData.accessTime_ = (qint64)puStack_70;
        (this->currentEntryInfo).metaData.birthTime_ = (qint64)local_68;
        *(undefined1 **)&(this->currentEntryInfo).metaData = puStack_80;
        (this->currentEntryInfo).metaData.size_ = (qint64)local_78;
        local_b8 = _Var6;
        pcStack_b0 = pcVar7;
        local_a8 = puVar3;
        pQStack_a0 = pQVar8;
        local_98 = pcVar9;
        puStack_90 = puVar4;
        local_88 = puVar10;
        std::_Optional_payload_base<QFileInfo>::_M_move_assign
                  ((_Optional_payload_base<QFileInfo> *)&(this->currentEntryInfo).fileInfoOpt,
                   (_Optional_payload_base<QFileInfo> *)&local_48._M_value);
        if ((char)puStack_40 == '\x01') {
          puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
          QFileInfo::~QFileInfo(&local_48._M_value);
        }
        if (pQStack_a0 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQStack_a0,1,0x10);
          }
        }
        if ((QArrayData *)local_b8.field2 != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_b8 = *(int *)local_b8 + -1;
          UNLOCK();
          if (*(int *)local_b8 == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
      } while (!bVar11);
      if ((char)iVar13 != '\0') break;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00231aa1:
  __stack_chk_fail();
}

Assistant:

void QDirListingPrivate::advance()
{
    // Use get() in both code paths below because the iterator returned by back()
    // may be invalidated due to reallocation when appending new iterators in
    // pushDirectory().

    if (engine) {
        while (!fileEngineIterators.empty()) {
            // Find the next valid iterator that matches the filters.
            QAbstractFileEngineIterator *it;
            while (it = fileEngineIterators.back().get(), it->advance()) {
                QDirEntryInfo entryInfo;
                entryInfo.fileInfoOpt = it->currentFileInfo();
                if (entryMatches(entryInfo)) {
                    currentEntryInfo = std::move(entryInfo);
                    return;
                }
            }

            fileEngineIterators.pop_back();
        }
    } else {
#ifndef QT_NO_FILESYSTEMITERATOR
        QDirEntryInfo entryInfo;
        while (!nativeIterators.empty()) {
            // Find the next valid iterator that matches the filters.
            QFileSystemIterator *it;
            while (it = nativeIterators.back().get(),
                   it->advance(entryInfo.entry, entryInfo.metaData)) {
                if (entryMatches(entryInfo)) {
                    currentEntryInfo = std::move(entryInfo);
                    return;
                }
                entryInfo = {};
            }

            nativeIterators.pop_back();
        }
#endif
    }
}